

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

void google::protobuf::File::ReadFileToStringOrDie(string *name,string *output)

{
  bool bVar1;
  char *failure_msg;
  LogMessage *pLVar2;
  Status *local_70;
  LogMessage local_50;
  Voidify local_3d [13];
  Status local_30;
  undefined1 local_28 [8];
  pair<const_absl::lts_20250127::Status_*,_const_char_*> absl_log_internal_check_ok_goo;
  string *output_local;
  string *name_local;
  
  absl_log_internal_check_ok_goo.second = (char *)output;
  std::pair<const_absl::lts_20250127::Status_*,_const_char_*>::
  pair<const_absl::lts_20250127::Status_*,_const_char_*,_true>
            ((pair<const_absl::lts_20250127::Status_*,_const_char_*> *)local_28);
  ReadFileToString((File *)&local_30,name,(string *)absl_log_internal_check_ok_goo.second,false);
  local_28 = (undefined1  [8])absl::lts_20250127::log_internal::AsStatus(&local_30);
  bVar1 = absl::lts_20250127::Status::ok((Status *)local_28);
  if (bVar1) {
    local_70 = (Status *)0x0;
  }
  else {
    local_70 = (Status *)
               absl::lts_20250127::status_internal::MakeCheckFailString
                         ((Nonnull<const_absl::Status_*>)local_28,
                          "ReadFileToString(name, output) is OK");
  }
  absl_log_internal_check_ok_goo.first = local_70;
  bVar1 = absl::lts_20250127::Status::ok((Status *)local_28);
  absl::lts_20250127::Status::~Status(&local_30);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>
                          ((type_identity_t<const_char_*>)absl_log_internal_check_ok_goo.first);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/testing/file.cc"
             ,0x4d,failure_msg);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [17])"Could not read: ");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,name);
  absl::lts_20250127::log_internal::Voidify::operator&&(local_3d,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_50);
}

Assistant:

void File::ReadFileToStringOrDie(const std::string& name, std::string* output) {
  ABSL_CHECK_OK(ReadFileToString(name, output)) << "Could not read: " << name;
}